

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Crop_x86_avx2::forward(Crop_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  ulong uVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  size_t sVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined4 uVar19;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined8 uVar27;
  int iVar34;
  int iVar35;
  long lVar36;
  sbyte sVar37;
  uint uVar38;
  int iVar39;
  int unaff_EBP;
  uint uVar40;
  int iVar41;
  long lVar42;
  bool bVar43;
  bool bVar44;
  Mat local_168;
  int _outw;
  int _outh;
  int _woffset;
  uint local_114;
  int _outc;
  int _outd;
  int _hoffset;
  uint local_104;
  int local_100;
  int local_fc;
  Mat m;
  int _coffset;
  Mat m_1;
  int _doffset;
  Crop_x86_avx2 *local_40;
  Option *local_38;
  undefined4 uVar13;
  undefined3 uVar15;
  undefined2 uVar17;
  undefined4 uVar21;
  undefined3 uVar23;
  undefined2 uVar25;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined3 uVar30;
  undefined1 uVar31;
  undefined2 uVar32;
  undefined1 uVar33;
  
  local_114 = bottom_blob->w;
  local_104 = bottom_blob->h;
  uVar38 = bottom_blob->d;
  local_fc = bottom_blob->c;
  iVar41 = bottom_blob->dims;
  uVar1 = bottom_blob->elemsize;
  iVar39 = bottom_blob->elempack;
  if (iVar39 == 8) {
    if (iVar41 - 1U < 4) {
      lVar36 = (long)(int)local_114;
      local_168.w = local_114;
      switch(iVar41) {
      case 1:
        local_168.w = local_114 * 8;
        local_168.dims = 1;
        local_168.h = 1;
        local_168.d = 1;
        local_168.c = 1;
        local_168.cstep = (size_t)local_168.w;
        goto LAB_001c0a1f;
      case 2:
        local_168.h = local_104 * 8;
        local_168.elemsize._0_4_ = 4;
        local_168.elempack = 1;
        local_168.dims = 2;
        local_168.d = 1;
        local_168.c = 1;
        local_168.cstep = local_168.h * lVar36;
        goto LAB_001c0aa3;
      case 3:
        local_168.dims = 3;
        local_168.d = 1;
        lVar36 = (int)local_104 * lVar36;
        break;
      case 4:
        local_168.dims = 4;
        lVar36 = (int)local_104 * lVar36 * (long)(int)uVar38;
        local_168.d = uVar38;
      }
      local_168.c = local_fc * 8;
      local_168.cstep = lVar36 + 3U & 0x3ffffffffffffffc;
      local_168.h = local_104;
LAB_001c0a1f:
      local_168.elemsize._0_4_ = 4;
      local_168.elempack = 1;
    }
    else {
      local_168.cstep = 0;
      local_168.elemsize._0_4_ = 0;
      local_168.elempack = 0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
    }
LAB_001c0aa3:
    local_168.elemsize._4_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.refcount._0_4_ = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.data = (void *)0x0;
    local_100 = iVar39;
    Crop::resolve_crop_roi
              ((Crop *)((long)&this->_vptr_Crop_x86_avx2 + (long)this->_vptr_Crop_x86_avx2[-3]),
               &local_168,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
    piVar2 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (iVar41 == 1) {
      uVar40 = _outw & 7;
      bVar43 = (_outw & 3U) == 0;
      iVar39 = 8;
      if (uVar40 != 0) {
        iVar39 = (uint)bVar43 * 3 + 1;
      }
      sVar37 = 3;
      if (uVar40 != 0) {
        sVar37 = bVar43 * '\x02';
      }
      if (_outw / iVar39 == local_114 && uVar40 == 0) {
        if (top_blob != bottom_blob) {
          piVar2 = bottom_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              pvVar3 = top_blob->data;
              pAVar4 = top_blob->allocator;
              if (pAVar4 == (Allocator *)0x0) {
                if (pvVar3 != (void *)0x0) {
                  free(pvVar3);
                }
              }
              else {
                (*pAVar4->_vptr_Allocator[3])(pAVar4,pvVar3,(long)_outw % (long)iVar39 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar2 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar2;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar39 = bottom_blob->w;
          iVar34 = bottom_blob->h;
          iVar35 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar39;
          top_blob->h = iVar34;
          top_blob->d = iVar35;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_001c0c97:
        bVar43 = false;
        unaff_EBP = 0;
      }
      else if (((_outw | _woffset) & 7U) == 0) {
        Mat::create(top_blob,_outw / iVar39,(uVar1 >> 3) << sVar37,8,opt->blob_allocator);
        unaff_EBP = -100;
        if (top_blob->data == (void *)0x0) {
          bVar43 = false;
        }
        else {
          bVar43 = false;
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar39 = _woffset + 7;
            if (-1 < _woffset) {
              iVar39 = _woffset;
            }
            crop_pack8_avx(bottom_blob,top_blob,0,iVar39 >> 3);
            goto LAB_001c0c97;
          }
        }
      }
      else {
        bVar43 = true;
      }
      if (bVar43) goto LAB_001c0ca9;
LAB_001c1ad3:
      bVar43 = false;
    }
    else {
LAB_001c0ca9:
      if (iVar41 == 2) {
        sVar37 = 3;
        if ((_outh & 7U) != 0) {
          sVar37 = ((_outh & 3U) == 0) * '\x02';
        }
        if (_outw == local_114) {
          iVar39 = 8;
          if ((_outh & 7U) != 0) {
            iVar39 = (uint)((_outh & 3U) == 0) * 3 + 1;
          }
          if (((_outh & 7U) != 0) || (_outh / iVar39 != local_104)) goto LAB_001c0d53;
          if (top_blob != bottom_blob) {
            piVar2 = bottom_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                pvVar3 = top_blob->data;
                pAVar4 = top_blob->allocator;
                if (pAVar4 == (Allocator *)0x0) {
                  if (pvVar3 != (void *)0x0) {
                    free(pvVar3);
                  }
                }
                else {
                  (*pAVar4->_vptr_Allocator[3])
                            (pAVar4,pvVar3,(long)_outh % (long)iVar39 & 0xffffffff);
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            piVar2 = bottom_blob->refcount;
            top_blob->data = bottom_blob->data;
            top_blob->refcount = piVar2;
            top_blob->elemsize = bottom_blob->elemsize;
            top_blob->elempack = bottom_blob->elempack;
            top_blob->allocator = bottom_blob->allocator;
            iVar39 = bottom_blob->w;
            iVar34 = bottom_blob->h;
            iVar35 = bottom_blob->d;
            top_blob->dims = bottom_blob->dims;
            top_blob->w = iVar39;
            top_blob->h = iVar34;
            top_blob->d = iVar35;
            top_blob->c = bottom_blob->c;
            top_blob->cstep = bottom_blob->cstep;
          }
LAB_001c0e39:
          bVar43 = false;
          unaff_EBP = 0;
        }
        else {
LAB_001c0d53:
          bVar43 = true;
          if (((_hoffset | _outh) & 7U) == 0) {
            iVar39 = _outh + 7;
            if (-1 < _outh) {
              iVar39 = _outh;
            }
            Mat::create(top_blob,_outw,iVar39 >> 3,(uVar1 >> 3) << sVar37,8,opt->blob_allocator);
            unaff_EBP = -100;
            if (top_blob->data == (void *)0x0) {
              bVar43 = false;
            }
            else {
              bVar43 = false;
              if ((long)top_blob->c * top_blob->cstep != 0) {
                iVar39 = _hoffset + 7;
                if (-1 < _hoffset) {
                  iVar39 = _hoffset;
                }
                crop_pack8_avx(bottom_blob,top_blob,iVar39 >> 3,_woffset);
                goto LAB_001c0e39;
              }
            }
          }
        }
        if (!bVar43) goto LAB_001c1ad3;
      }
      if (iVar41 == 3) {
        sVar37 = 3;
        if ((_outc & 7U) != 0) {
          sVar37 = ((_outc & 3U) == 0) * '\x02';
        }
        uVar40 = _outh ^ local_104 | _outw ^ local_114;
        bVar43 = uVar40 == 0;
        if (bVar43) {
          iVar39 = 8;
          if ((_outc & 7U) != 0) {
            iVar39 = (uint)((_outc & 3U) == 0) * 3 + 1;
          }
          if (((_outc & 7U) != 0) || (_outc / iVar39 != local_fc)) goto LAB_001c0f0b;
          if (top_blob != bottom_blob) {
            piVar2 = bottom_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                pvVar3 = top_blob->data;
                pAVar4 = top_blob->allocator;
                if (pAVar4 == (Allocator *)0x0) {
                  if (pvVar3 != (void *)0x0) {
                    free(pvVar3);
                  }
                }
                else {
                  (*pAVar4->_vptr_Allocator[3])
                            (pAVar4,pvVar3,(long)_outc % (long)iVar39 & 0xffffffff);
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            piVar2 = bottom_blob->refcount;
            top_blob->data = bottom_blob->data;
            top_blob->refcount = piVar2;
            top_blob->elemsize = bottom_blob->elemsize;
            top_blob->elempack = bottom_blob->elempack;
            top_blob->allocator = bottom_blob->allocator;
            iVar39 = bottom_blob->w;
            iVar34 = bottom_blob->h;
            iVar35 = bottom_blob->d;
            top_blob->dims = bottom_blob->dims;
            top_blob->w = iVar39;
            top_blob->h = iVar34;
            top_blob->d = iVar35;
            top_blob->c = bottom_blob->c;
            top_blob->cstep = bottom_blob->cstep;
          }
          bVar44 = false;
          unaff_EBP = 0;
        }
        else {
LAB_001c0f0b:
          bVar44 = true;
          if (((_coffset | _outc) & 7U) == 0) {
            iVar39 = _coffset + 7;
            if (-1 < _coffset) {
              iVar39 = _coffset;
            }
            local_168.c = _outc + 7;
            if (-1 < _outc) {
              local_168.c = _outc;
            }
            local_168.c = local_168.c >> 3;
            local_168.w = bottom_blob->w;
            local_168.h = bottom_blob->h;
            if (bottom_blob->dims == 3) {
              local_168.cstep = bottom_blob->elemsize;
              local_168.data =
                   (void *)((long)(iVar39 >> 3) * bottom_blob->cstep * local_168.cstep +
                           (long)bottom_blob->data);
              local_168.elempack = bottom_blob->elempack;
              local_168.allocator = bottom_blob->allocator;
              local_168.elemsize._0_4_ = (undefined4)local_168.cstep;
              local_168.elemsize._4_4_ = (undefined4)(local_168.cstep >> 0x20);
              local_168.dims = 3;
              local_168.d = 1;
              lVar36 = (long)local_168.h * (long)local_168.w * local_168.cstep;
            }
            else {
              local_168.cstep = bottom_blob->elemsize;
              local_168.data =
                   (void *)((long)(iVar39 >> 3) * bottom_blob->cstep * local_168.cstep +
                           (long)bottom_blob->data);
              local_168.d = bottom_blob->d;
              local_168.elempack = bottom_blob->elempack;
              local_168.allocator = bottom_blob->allocator;
              local_168.elemsize._0_4_ = (undefined4)local_168.cstep;
              local_168.elemsize._4_4_ = (undefined4)(local_168.cstep >> 0x20);
              local_168.dims = 4;
              lVar36 = (long)local_168.h * (long)local_168.w * (long)local_168.d * local_168.cstep;
            }
            local_168.refcount._4_4_ = 0;
            local_168.refcount._0_4_ = 0;
            local_168.cstep = (lVar36 + 0xfU & 0xfffffffffffffff0) / local_168.cstep;
            if (bVar43) {
              Mat::clone(&m,(__fn *)&local_168,(void *)0x0,CONCAT31((int3)(uVar40 >> 8),bVar43),
                         local_168.data);
              if (&m != top_blob) {
                piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + 1;
                  UNLOCK();
                }
                piVar2 = top_blob->refcount;
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    if (top_blob->allocator == (Allocator *)0x0) {
                      if (top_blob->data != (void *)0x0) {
                        free(top_blob->data);
                      }
                    }
                    else {
                      (*top_blob->allocator->_vptr_Allocator[3])();
                    }
                  }
                }
                top_blob->cstep = 0;
                top_blob->data = (void *)0x0;
                top_blob->refcount = (int *)0x0;
                *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
                *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
                top_blob->dims = 0;
                top_blob->w = 0;
                top_blob->h = 0;
                top_blob->d = 0;
                top_blob->c = 0;
                top_blob->data = m.data;
                top_blob->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                top_blob->elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                top_blob->elempack = m.elempack;
                top_blob->allocator = m.allocator;
                top_blob->dims = m.dims;
                top_blob->w = m.w;
                top_blob->h = m.h;
                top_blob->d = m.d;
                top_blob->c = m.c;
                top_blob->cstep = m.cstep;
              }
              piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    if (m.data != (void *)0x0) {
                      free(m.data);
                    }
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              unaff_EBP = -100;
              if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
              goto LAB_001c11d6;
            }
            else {
LAB_001c11d6:
              iVar39 = _outc + 7;
              if (-1 < _outc) {
                iVar39 = _outc;
              }
              Mat::create(top_blob,_outw,_outh,iVar39 >> 3,(uVar1 >> 3) << sVar37,8,
                          opt->blob_allocator);
              unaff_EBP = -100;
              if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
                if (0 < top_blob->c) {
                  lVar36 = 0;
                  do {
                    if (local_168.dims == 3) {
                      lVar42 = local_168.cstep * lVar36 *
                               CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
                      m.dims = 2;
                      m.c = 1;
                    }
                    else {
                      lVar42 = local_168.cstep * lVar36 *
                               CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
                      m.dims = 3;
                      m.c = local_168.d;
                    }
                    m.data = (void *)(lVar42 + (long)local_168.data);
                    m.d = 1;
                    m.w = local_168.w;
                    m.allocator = local_168.allocator;
                    m.elempack = local_168.elempack;
                    m.elemsize._4_4_ = local_168.elemsize._4_4_;
                    m.elemsize._0_4_ = (undefined4)local_168.elemsize;
                    m.refcount._4_4_ = 0;
                    m.refcount._0_4_ = 0;
                    m.h = local_168.h;
                    m.cstep = (long)local_168.h * (long)local_168.w;
                    if (top_blob->dims == 3) {
                      iVar39 = top_blob->w;
                      sVar5 = top_blob->elemsize;
                      m_1.data = (void *)(top_blob->cstep * lVar36 * sVar5 + (long)top_blob->data);
                      m_1.h = top_blob->h;
                      m_1.elempack = top_blob->elempack;
                      m_1.allocator = top_blob->allocator;
                      m_1.elemsize._0_4_ = (undefined4)sVar5;
                      m_1.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
                      m_1.w = iVar39;
                      m_1.dims = 2;
                      m_1.c = 1;
                    }
                    else {
                      iVar39 = top_blob->w;
                      m_1.h = top_blob->h;
                      m_1.c = top_blob->d;
                      sVar5 = top_blob->elemsize;
                      m_1.data = (void *)(top_blob->cstep * lVar36 * sVar5 + (long)top_blob->data);
                      m_1.elempack = top_blob->elempack;
                      m_1.allocator = top_blob->allocator;
                      m_1.elemsize._0_4_ = (undefined4)sVar5;
                      m_1.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
                      m_1.w = iVar39;
                      m_1.dims = 3;
                    }
                    m_1.d = 1;
                    m_1.refcount._4_4_ = 0;
                    m_1.refcount._0_4_ = 0;
                    m_1.cstep = (long)m_1.h * (long)iVar39;
                    crop_pack8_avx(&m,&m_1,_hoffset,_woffset);
                    piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar2 != (int *)0x0) {
                      LOCK();
                      *piVar2 = *piVar2 + -1;
                      UNLOCK();
                      if (*piVar2 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m_1.cstep = 0;
                    m_1.data = (void *)0x0;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = 0;
                    m_1.elemsize._4_4_ = 0;
                    m_1.elempack = 0;
                    m_1.dims = 0;
                    m_1.w = 0;
                    m_1.h = 0;
                    m_1.d = 0;
                    m_1.c = 0;
                    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar2 != (int *)0x0) {
                      LOCK();
                      *piVar2 = *piVar2 + -1;
                      UNLOCK();
                      if (*piVar2 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m.cstep = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    lVar36 = lVar36 + 1;
                  } while (lVar36 < top_blob->c);
                }
                unaff_EBP = 0;
              }
            }
            piVar2 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (local_168.allocator == (Allocator *)0x0) {
                  if (local_168.data != (void *)0x0) {
                    free(local_168.data);
                  }
                }
                else {
                  (*(local_168.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            bVar44 = false;
          }
        }
        if (!bVar44) goto LAB_001c1ad3;
      }
      bVar43 = true;
      if (iVar41 == 4) {
        sVar37 = 3;
        if ((_outc & 7U) != 0) {
          sVar37 = ((_outc & 3U) == 0) * '\x02';
        }
        uVar40 = _outh ^ local_104 | _outw ^ local_114;
        bVar44 = _outd == uVar38;
        bVar6 = uVar40 == 0;
        if (bVar44 && bVar6) {
          iVar39 = 8;
          if ((_outc & 7U) != 0) {
            iVar39 = (uint)((_outc & 3U) == 0) * 3 + 1;
          }
          if (((_outc & 7U) == 0) && (_outc / iVar39 == local_fc)) {
            if (top_blob != bottom_blob) {
              piVar2 = bottom_blob->refcount;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + 1;
                UNLOCK();
              }
              piVar2 = top_blob->refcount;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  pvVar3 = top_blob->data;
                  pAVar4 = top_blob->allocator;
                  if (pAVar4 == (Allocator *)0x0) {
                    if (pvVar3 != (void *)0x0) {
                      free(pvVar3);
                    }
                  }
                  else {
                    (*pAVar4->_vptr_Allocator[3])
                              (pAVar4,pvVar3,(long)_outc % (long)iVar39 & 0xffffffff);
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              piVar2 = bottom_blob->refcount;
              top_blob->data = bottom_blob->data;
              top_blob->refcount = piVar2;
              top_blob->elemsize = bottom_blob->elemsize;
              top_blob->elempack = bottom_blob->elempack;
              top_blob->allocator = bottom_blob->allocator;
              iVar39 = bottom_blob->w;
              iVar34 = bottom_blob->h;
              iVar35 = bottom_blob->d;
              top_blob->dims = bottom_blob->dims;
              top_blob->w = iVar39;
              top_blob->h = iVar34;
              top_blob->d = iVar35;
              top_blob->c = bottom_blob->c;
              top_blob->cstep = bottom_blob->cstep;
            }
            bVar43 = false;
            unaff_EBP = 0;
            goto LAB_001c1ad5;
          }
        }
        if (((_coffset | _outc) & 7U) == 0) {
          iVar39 = _coffset + 7;
          if (-1 < _coffset) {
            iVar39 = _coffset;
          }
          local_168.c = _outc + 7;
          if (-1 < _outc) {
            local_168.c = _outc;
          }
          local_168.c = local_168.c >> 3;
          local_168.w = bottom_blob->w;
          local_168.h = bottom_blob->h;
          if (bottom_blob->dims == 3) {
            local_168.cstep = bottom_blob->elemsize;
            local_168.data =
                 (void *)((long)(iVar39 >> 3) * bottom_blob->cstep * local_168.cstep +
                         (long)bottom_blob->data);
            local_168.elempack = bottom_blob->elempack;
            local_168.allocator = bottom_blob->allocator;
            local_168.elemsize._0_4_ = (undefined4)local_168.cstep;
            local_168.elemsize._4_4_ = (undefined4)(local_168.cstep >> 0x20);
            local_168.dims = 3;
            local_168.d = 1;
            lVar36 = (long)local_168.h * (long)local_168.w * local_168.cstep;
          }
          else {
            local_168.cstep = bottom_blob->elemsize;
            local_168.data =
                 (void *)((long)(iVar39 >> 3) * bottom_blob->cstep * local_168.cstep +
                         (long)bottom_blob->data);
            local_168.d = bottom_blob->d;
            local_168.elempack = bottom_blob->elempack;
            local_168.allocator = bottom_blob->allocator;
            local_168.elemsize._0_4_ = (undefined4)local_168.cstep;
            local_168.elemsize._4_4_ = (undefined4)(local_168.cstep >> 0x20);
            local_168.dims = 4;
            lVar36 = (long)local_168.h * (long)local_168.w * (long)local_168.d * local_168.cstep;
          }
          local_168.refcount._4_4_ = 0;
          local_168.refcount._0_4_ = 0;
          local_168.cstep = (lVar36 + 0xfU & 0xfffffffffffffff0) / local_168.cstep;
          if (bVar44 && bVar6) {
            Mat::clone(&m,(__fn *)&local_168,(void *)0x0,
                       CONCAT31((int3)(uVar40 >> 8),bVar44 && bVar6),local_168.data);
            Mat::operator=(top_blob,&m);
            Mat::~Mat(&m);
            unaff_EBP = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_001c17d2;
          }
          else {
LAB_001c17d2:
            iVar39 = _outc + 7;
            if (-1 < _outc) {
              iVar39 = _outc;
            }
            Mat::create(top_blob,_outw,_outh,_outd,iVar39 >> 3,(uVar1 >> 3) << sVar37,8,
                        opt->blob_allocator);
            unaff_EBP = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                unaff_EBP = 0;
              }
              else {
                lVar36 = 0;
                local_40 = this;
                local_38 = opt;
                do {
                  if (0 < _outd) {
                    lVar42 = 0;
                    do {
                      m.cstep = (long)local_168.h * (long)local_168.w;
                      m.data = (void *)((long)local_168.data +
                                       (long)(_doffset + (int)lVar42) *
                                       CONCAT44(local_168.elemsize._4_4_,
                                                (undefined4)local_168.elemsize) * m.cstep +
                                       local_168.cstep * lVar36 *
                                       CONCAT44(local_168.elemsize._4_4_,
                                                (undefined4)local_168.elemsize));
                      m.refcount._0_4_ = 0;
                      m.refcount._4_4_ = 0;
                      m.elemsize._0_4_ = (undefined4)local_168.elemsize;
                      m.elemsize._4_4_ = local_168.elemsize._4_4_;
                      m.elempack = local_168.elempack;
                      m.allocator = local_168.allocator;
                      m.w = local_168.w;
                      m.dims = 2;
                      m.h = local_168.h;
                      m.d = 1;
                      m.c = 1;
                      sVar5 = top_blob->elemsize;
                      m_1.elempack = top_blob->elempack;
                      m_1.allocator = top_blob->allocator;
                      m_1.h = top_blob->h;
                      m_1.cstep = (long)m_1.h * (long)top_blob->w;
                      m_1.data = (void *)((long)top_blob->data +
                                         lVar42 * sVar5 * m_1.cstep +
                                         top_blob->cstep * lVar36 * sVar5);
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)sVar5;
                      m_1.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
                      m_1.w = top_blob->w;
                      m_1.dims = 2;
                      m_1.d = 1;
                      m_1.c = 1;
                      crop_pack8_avx(&m,&m_1,_hoffset,_woffset);
                      piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar2 != (int *)0x0) {
                        LOCK();
                        *piVar2 = *piVar2 + -1;
                        UNLOCK();
                        if (*piVar2 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                      if (piVar2 != (int *)0x0) {
                        LOCK();
                        *piVar2 = *piVar2 + -1;
                        UNLOCK();
                        if (*piVar2 == 0) {
                          if (m.allocator == (Allocator *)0x0) {
                            if (m.data != (void *)0x0) {
                              free(m.data);
                            }
                          }
                          else {
                            (*(m.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m.cstep = 0;
                      m.data = (void *)0x0;
                      m.refcount._0_4_ = 0;
                      m.refcount._4_4_ = 0;
                      m.elemsize._0_4_ = 0;
                      m.elemsize._4_4_ = 0;
                      m.elempack = 0;
                      m.dims = 0;
                      m.w = 0;
                      m.h = 0;
                      m.d = 0;
                      m.c = 0;
                      lVar42 = lVar42 + 1;
                    } while (lVar42 < _outd);
                  }
                  lVar36 = lVar36 + 1;
                } while (lVar36 < top_blob->c);
                unaff_EBP = 0;
                this = local_40;
                opt = local_38;
              }
            }
          }
          piVar2 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_168.allocator == (Allocator *)0x0) {
                if (local_168.data != (void *)0x0) {
                  free(local_168.data);
                }
              }
              else {
                (*(local_168.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          goto LAB_001c1ad3;
        }
      }
    }
LAB_001c1ad5:
    iVar39 = local_100;
    if (!bVar43) {
      return unaff_EBP;
    }
  }
  if (iVar39 != 4) goto LAB_001c2c62;
  switch(bottom_blob->dims) {
  case 1:
    local_168.cstep = (long)bottom_blob->elempack * (long)bottom_blob->w;
    local_168.elemsize._0_4_ = 4;
    local_168.elempack = 1;
    local_168.dims = 1;
    local_168.w = (int)local_168.cstep;
    local_168.h = 1;
    local_168.d = 1;
    local_168.c = 1;
    break;
  case 2:
    local_168.w = bottom_blob->w;
    lVar36 = (long)bottom_blob->elempack * (long)bottom_blob->h;
    local_168.elemsize._0_4_ = 4;
    local_168.elempack = 1;
    local_168.dims = 2;
    local_168.h = (int)lVar36;
    local_168.d = 1;
    local_168.c = 1;
    local_168.cstep = lVar36 * local_168.w;
    break;
  case 3:
    local_168.w = bottom_blob->w;
    local_168.h = bottom_blob->h;
    local_168.c = bottom_blob->elempack * bottom_blob->c;
    local_168.dims = 3;
    local_168.d = 1;
    lVar36 = (long)local_168.h * (long)local_168.w;
    goto LAB_001c1c21;
  case 4:
    local_168.w = bottom_blob->w;
    local_168.h = bottom_blob->h;
    local_168.d = bottom_blob->d;
    local_168.c = bottom_blob->elempack * bottom_blob->c;
    local_168.dims = 4;
    lVar36 = (long)local_168.h * (long)local_168.w * (long)local_168.d;
LAB_001c1c21:
    local_168.elempack = 1;
    local_168.elemsize._0_4_ = 4;
    local_168.cstep = lVar36 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    local_168.cstep = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elempack = 0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
  }
  local_168.elemsize._4_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.refcount._0_4_ = 0;
  local_168.allocator = (Allocator *)0x0;
  local_168.data = (void *)0x0;
  local_100 = iVar39;
  Crop::resolve_crop_roi
            ((Crop *)((long)&this->_vptr_Crop_x86_avx2 + (long)this->_vptr_Crop_x86_avx2[-3]),
             &local_168,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar2 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (iVar41 == 1) {
    uVar40 = _outw & 7;
    bVar43 = (_outw & 3U) == 0;
    iVar39 = 8;
    if (uVar40 != 0) {
      iVar39 = (uint)bVar43 * 3 + 1;
    }
    sVar37 = 3;
    if (uVar40 != 0) {
      sVar37 = bVar43 * '\x02';
    }
    if (uVar40 == 4 && _outw / iVar39 == local_114) {
      if (top_blob != bottom_blob) {
        piVar2 = bottom_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar2 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar2;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar39 = bottom_blob->w;
        iVar34 = bottom_blob->h;
        iVar35 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar39;
        top_blob->h = iVar34;
        top_blob->d = iVar35;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
LAB_001c1eab:
      bVar43 = false;
      unaff_EBP = 0;
    }
    else {
      bVar43 = true;
      if ((uVar40 == 4) && ((_woffset & 3U) == 0)) {
        Mat::create(top_blob,_outw / iVar39,(uVar1 >> 2) << sVar37,4,opt->blob_allocator);
        unaff_EBP = -100;
        if (top_blob->data == (void *)0x0) {
          bVar43 = false;
        }
        else {
          bVar43 = false;
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar39 = _woffset + 3;
            if (-1 < _woffset) {
              iVar39 = _woffset;
            }
            crop_pack4_sse(bottom_blob,top_blob,0,iVar39 >> 2);
            goto LAB_001c1eab;
          }
        }
      }
    }
    if (bVar43) goto LAB_001c1eb5;
LAB_001c2c53:
    bVar43 = false;
  }
  else {
LAB_001c1eb5:
    if (iVar41 == 2) {
      sVar37 = 3;
      if ((_outh & 7U) != 0) {
        sVar37 = ((_outh & 3U) == 0) * '\x02';
      }
      if (_outw == local_114) {
        iVar39 = 8;
        if ((_outh & 7U) != 0) {
          iVar39 = (uint)((_outh & 3U) == 0) * 3 + 1;
        }
        if (((_outh & 7U) != 4) || (_outh / iVar39 != local_104)) goto LAB_001c1f6b;
        if (top_blob != bottom_blob) {
          piVar2 = bottom_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              pvVar3 = top_blob->data;
              pAVar4 = top_blob->allocator;
              if (pAVar4 == (Allocator *)0x0) {
                if (pvVar3 != (void *)0x0) {
                  free(pvVar3);
                }
              }
              else {
                (*pAVar4->_vptr_Allocator[3])(pAVar4,pvVar3,(long)_outh % (long)iVar39 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar2 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar2;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar39 = bottom_blob->w;
          iVar34 = bottom_blob->h;
          iVar35 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar39;
          top_blob->h = iVar34;
          top_blob->d = iVar35;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_001c205b:
        bVar43 = false;
        unaff_EBP = 0;
      }
      else {
LAB_001c1f6b:
        bVar43 = true;
        if (((_outh & 7U) == 4) && ((_hoffset & 3U) == 0)) {
          Mat::create(top_blob,_outw,_outh >> 2,(uVar1 >> 2) << sVar37,4,opt->blob_allocator);
          unaff_EBP = -100;
          if (top_blob->data == (void *)0x0) {
            bVar43 = false;
          }
          else {
            bVar43 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar39 = _hoffset + 3;
              if (-1 < _hoffset) {
                iVar39 = _hoffset;
              }
              crop_pack4_sse(bottom_blob,top_blob,iVar39 >> 2,_woffset);
              goto LAB_001c205b;
            }
          }
        }
      }
      if (!bVar43) goto LAB_001c2c53;
    }
    if (iVar41 == 3) {
      sVar37 = 3;
      if ((_outc & 7U) != 0) {
        sVar37 = ((_outc & 3U) == 0) * '\x02';
      }
      uVar40 = _outh ^ local_104 | _outw ^ local_114;
      bVar43 = uVar40 == 0;
      if (bVar43) {
        iVar39 = 8;
        if ((_outc & 7U) != 0) {
          iVar39 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        if (((_outc & 7U) != 4) || (_outc / iVar39 != local_fc)) goto LAB_001c212e;
        if (top_blob != bottom_blob) {
          piVar2 = bottom_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              pvVar3 = top_blob->data;
              pAVar4 = top_blob->allocator;
              if (pAVar4 == (Allocator *)0x0) {
                if (pvVar3 != (void *)0x0) {
                  free(pvVar3);
                }
              }
              else {
                (*pAVar4->_vptr_Allocator[3])(pAVar4,pvVar3,(long)_outc % (long)iVar39 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar2 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar2;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar39 = bottom_blob->w;
          iVar34 = bottom_blob->h;
          iVar35 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar39;
          top_blob->h = iVar34;
          top_blob->d = iVar35;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar44 = false;
        unaff_EBP = 0;
      }
      else {
LAB_001c212e:
        bVar44 = true;
        if ((_outc & 7U) == 4 && (_coffset & 3U) == 0) {
          local_168.c = _outc >> 2;
          local_168.w = bottom_blob->w;
          local_168.h = bottom_blob->h;
          if (bottom_blob->dims == 3) {
            local_168.cstep = bottom_blob->elemsize;
            local_168.data =
                 (void *)((long)(_coffset >> 2) * bottom_blob->cstep * local_168.cstep +
                         (long)bottom_blob->data);
            local_168.elempack = bottom_blob->elempack;
            local_168.allocator = bottom_blob->allocator;
            local_168.elemsize._0_4_ = (undefined4)local_168.cstep;
            local_168.elemsize._4_4_ = (undefined4)(local_168.cstep >> 0x20);
            local_168.dims = 3;
            local_168.d = 1;
            lVar36 = (long)local_168.h * (long)local_168.w * local_168.cstep;
          }
          else {
            local_168.cstep = bottom_blob->elemsize;
            local_168.data =
                 (void *)((long)(_coffset >> 2) * bottom_blob->cstep * local_168.cstep +
                         (long)bottom_blob->data);
            local_168.d = bottom_blob->d;
            local_168.elempack = bottom_blob->elempack;
            local_168.allocator = bottom_blob->allocator;
            local_168.elemsize._0_4_ = (undefined4)local_168.cstep;
            local_168.elemsize._4_4_ = (undefined4)(local_168.cstep >> 0x20);
            local_168.dims = 4;
            lVar36 = (long)local_168.h * (long)local_168.w * (long)local_168.d * local_168.cstep;
          }
          local_168.refcount._4_4_ = 0;
          local_168.refcount._0_4_ = 0;
          local_168.cstep = (lVar36 + 0xfU & 0xfffffffffffffff0) / local_168.cstep;
          if (bVar43) {
            Mat::clone(&m,(__fn *)&local_168,(void *)0x0,CONCAT31((int3)(uVar40 >> 8),bVar43),
                       local_168.data);
            Mat::operator=(top_blob,&m);
            Mat::~Mat(&m);
            unaff_EBP = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_001c2287;
          }
          else {
LAB_001c2287:
            iVar39 = _outc + 3;
            if (-1 < _outc) {
              iVar39 = _outc;
            }
            Mat::create(top_blob,_outw,_outh,iVar39 >> 2,(uVar1 >> 2) << sVar37,4,
                        opt->blob_allocator);
            unaff_EBP = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (0 < top_blob->c) {
                lVar36 = 0;
                do {
                  if (local_168.dims == 3) {
                    lVar42 = local_168.cstep * lVar36 *
                             CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
                    m.dims = 2;
                    m.c = 1;
                  }
                  else {
                    lVar42 = local_168.cstep * lVar36 *
                             CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
                    m.dims = 3;
                    m.c = local_168.d;
                  }
                  m.data = (void *)(lVar42 + (long)local_168.data);
                  m.d = 1;
                  m.w = local_168.w;
                  m.allocator = local_168.allocator;
                  m.elempack = local_168.elempack;
                  m.elemsize._4_4_ = local_168.elemsize._4_4_;
                  m.elemsize._0_4_ = (undefined4)local_168.elemsize;
                  m.refcount._4_4_ = 0;
                  m.refcount._0_4_ = 0;
                  m.h = local_168.h;
                  m.cstep = (long)local_168.h * (long)local_168.w;
                  if (top_blob->dims == 3) {
                    iVar39 = top_blob->w;
                    sVar5 = top_blob->elemsize;
                    m_1.data = (void *)(top_blob->cstep * lVar36 * sVar5 + (long)top_blob->data);
                    m_1.h = top_blob->h;
                    m_1.elempack = top_blob->elempack;
                    m_1.allocator = top_blob->allocator;
                    m_1.elemsize._0_4_ = (undefined4)sVar5;
                    m_1.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
                    m_1.w = iVar39;
                    m_1.dims = 2;
                    m_1.c = 1;
                  }
                  else {
                    iVar39 = top_blob->w;
                    m_1.h = top_blob->h;
                    m_1.c = top_blob->d;
                    sVar5 = top_blob->elemsize;
                    m_1.data = (void *)(top_blob->cstep * lVar36 * sVar5 + (long)top_blob->data);
                    m_1.elempack = top_blob->elempack;
                    m_1.allocator = top_blob->allocator;
                    m_1.elemsize._0_4_ = (undefined4)sVar5;
                    m_1.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
                    m_1.w = iVar39;
                    m_1.dims = 3;
                  }
                  m_1.d = 1;
                  m_1.refcount._4_4_ = 0;
                  m_1.refcount._0_4_ = 0;
                  m_1.cstep = (long)m_1.h * (long)iVar39;
                  crop_pack4_sse(&m,&m_1,_hoffset,_woffset);
                  piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar2 != (int *)0x0) {
                    LOCK();
                    *piVar2 = *piVar2 + -1;
                    UNLOCK();
                    if (*piVar2 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        if (m_1.data != (void *)0x0) {
                          free(m_1.data);
                        }
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_1.cstep = 0;
                  m_1.data = (void *)0x0;
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = 0;
                  m_1.elemsize._4_4_ = 0;
                  m_1.elempack = 0;
                  m_1.dims = 0;
                  m_1.w = 0;
                  m_1.h = 0;
                  m_1.d = 0;
                  m_1.c = 0;
                  piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                  if (piVar2 != (int *)0x0) {
                    LOCK();
                    *piVar2 = *piVar2 + -1;
                    UNLOCK();
                    if (*piVar2 == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        if (m.data != (void *)0x0) {
                          free(m.data);
                        }
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m.cstep = 0;
                  m.data = (void *)0x0;
                  m.refcount._0_4_ = 0;
                  m.refcount._4_4_ = 0;
                  m.elemsize._0_4_ = 0;
                  m.elemsize._4_4_ = 0;
                  m.elempack = 0;
                  m.dims = 0;
                  m.w = 0;
                  m.h = 0;
                  m.d = 0;
                  m.c = 0;
                  lVar36 = lVar36 + 1;
                } while (lVar36 < top_blob->c);
              }
              unaff_EBP = 0;
            }
          }
          piVar2 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_168.allocator == (Allocator *)0x0) {
                if (local_168.data != (void *)0x0) {
                  free(local_168.data);
                }
              }
              else {
                (*(local_168.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          bVar44 = false;
        }
      }
      if (bVar44) goto LAB_001c2742;
      bVar43 = false;
    }
    else {
LAB_001c2742:
      bVar43 = true;
      if (iVar41 == 4) {
        sVar37 = 3;
        if ((_outc & 7U) != 0) {
          sVar37 = ((_outc & 3U) == 0) * '\x02';
        }
        uVar38 = uVar38 ^ _outd | local_104 ^ _outh | local_114 ^ _outw;
        bVar44 = uVar38 == 0;
        if (bVar44) {
          iVar41 = 8;
          if ((_outc & 7U) != 0) {
            iVar41 = (uint)((_outc & 3U) == 0) * 3 + 1;
          }
          if (((_outc & 7U) == 4) && (_outc / iVar41 == local_fc)) {
            Mat::operator=(top_blob,bottom_blob);
            bVar43 = false;
            unaff_EBP = 0;
            goto LAB_001c2c55;
          }
        }
        if ((_outc & 7U) == 4 && (_coffset & 3U) == 0) {
          local_168.c = _outc >> 2;
          local_168.w = bottom_blob->w;
          local_168.h = bottom_blob->h;
          if (bottom_blob->dims == 3) {
            local_168.cstep = bottom_blob->elemsize;
            local_168.data =
                 (void *)((long)(_coffset >> 2) * bottom_blob->cstep * local_168.cstep +
                         (long)bottom_blob->data);
            local_168.elempack = bottom_blob->elempack;
            local_168.allocator = bottom_blob->allocator;
            local_168.elemsize._0_4_ = (undefined4)local_168.cstep;
            local_168.elemsize._4_4_ = (undefined4)(local_168.cstep >> 0x20);
            local_168.dims = 3;
            local_168.d = 1;
            lVar36 = (long)local_168.h * (long)local_168.w * local_168.cstep;
          }
          else {
            local_168.cstep = bottom_blob->elemsize;
            local_168.data =
                 (void *)((long)(_coffset >> 2) * bottom_blob->cstep * local_168.cstep +
                         (long)bottom_blob->data);
            local_168.d = bottom_blob->d;
            local_168.elempack = bottom_blob->elempack;
            local_168.allocator = bottom_blob->allocator;
            local_168.elemsize._0_4_ = (undefined4)local_168.cstep;
            local_168.elemsize._4_4_ = (undefined4)(local_168.cstep >> 0x20);
            local_168.dims = 4;
            lVar36 = (long)local_168.h * (long)local_168.w * (long)local_168.d * local_168.cstep;
          }
          local_168.refcount._4_4_ = 0;
          local_168.refcount._0_4_ = 0;
          local_168.cstep = (lVar36 + 0xfU & 0xfffffffffffffff0) / local_168.cstep;
          if (bVar44) {
            Mat::clone(&m,(__fn *)&local_168,(void *)0x0,CONCAT31((int3)(uVar38 >> 8),bVar44),
                       local_168.data);
            Mat::operator=(top_blob,&m);
            Mat::~Mat(&m);
            unaff_EBP = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_001c2945;
          }
          else {
LAB_001c2945:
            iVar41 = _outc + 3;
            if (-1 < _outc) {
              iVar41 = _outc;
            }
            Mat::create(top_blob,_outw,_outh,_outd,iVar41 >> 2,(uVar1 >> 2) << sVar37,4,
                        opt->blob_allocator);
            unaff_EBP = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                unaff_EBP = 0;
              }
              else {
                lVar36 = 0;
                local_40 = this;
                local_38 = opt;
                do {
                  if (0 < _outd) {
                    lVar42 = 0;
                    do {
                      m.cstep = (long)local_168.h * (long)local_168.w;
                      m.data = (void *)((long)local_168.data +
                                       (long)(_doffset + (int)lVar42) *
                                       CONCAT44(local_168.elemsize._4_4_,
                                                (undefined4)local_168.elemsize) * m.cstep +
                                       local_168.cstep * lVar36 *
                                       CONCAT44(local_168.elemsize._4_4_,
                                                (undefined4)local_168.elemsize));
                      m.refcount._0_4_ = 0;
                      m.refcount._4_4_ = 0;
                      m.elemsize._0_4_ = (undefined4)local_168.elemsize;
                      m.elemsize._4_4_ = local_168.elemsize._4_4_;
                      m.elempack = local_168.elempack;
                      m.allocator = local_168.allocator;
                      m.w = local_168.w;
                      m.dims = 2;
                      m.h = local_168.h;
                      m.d = 1;
                      m.c = 1;
                      sVar5 = top_blob->elemsize;
                      m_1.elempack = top_blob->elempack;
                      m_1.allocator = top_blob->allocator;
                      m_1.h = top_blob->h;
                      m_1.cstep = (long)m_1.h * (long)top_blob->w;
                      m_1.data = (void *)((long)top_blob->data +
                                         lVar42 * sVar5 * m_1.cstep +
                                         top_blob->cstep * lVar36 * sVar5);
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)sVar5;
                      m_1.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
                      m_1.w = top_blob->w;
                      m_1.dims = 2;
                      m_1.d = 1;
                      m_1.c = 1;
                      crop_pack4_sse(&m,&m_1,_hoffset,_woffset);
                      piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar2 != (int *)0x0) {
                        LOCK();
                        *piVar2 = *piVar2 + -1;
                        UNLOCK();
                        if (*piVar2 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                      if (piVar2 != (int *)0x0) {
                        LOCK();
                        *piVar2 = *piVar2 + -1;
                        UNLOCK();
                        if (*piVar2 == 0) {
                          if (m.allocator == (Allocator *)0x0) {
                            if (m.data != (void *)0x0) {
                              free(m.data);
                            }
                          }
                          else {
                            (*(m.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m.cstep = 0;
                      m.data = (void *)0x0;
                      m.refcount._0_4_ = 0;
                      m.refcount._4_4_ = 0;
                      m.elemsize._0_4_ = 0;
                      m.elemsize._4_4_ = 0;
                      m.elempack = 0;
                      m.dims = 0;
                      m.w = 0;
                      m.h = 0;
                      m.d = 0;
                      m.c = 0;
                      lVar42 = lVar42 + 1;
                    } while (lVar42 < _outd);
                  }
                  lVar36 = lVar36 + 1;
                } while (lVar36 < top_blob->c);
                unaff_EBP = 0;
                this = local_40;
                opt = local_38;
              }
            }
          }
          piVar2 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_168.allocator == (Allocator *)0x0) {
                if (local_168.data != (void *)0x0) {
                  free(local_168.data);
                }
              }
              else {
                (*(local_168.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          goto LAB_001c2c53;
        }
      }
    }
  }
LAB_001c2c55:
  iVar39 = local_100;
  if (bVar43) {
LAB_001c2c62:
    piVar2 = bottom_blob->refcount;
    local_168.data = bottom_blob->data;
    local_168.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
    local_168.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
    local_168.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
    local_168.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
    local_168.elempack = bottom_blob->elempack;
    local_168.allocator = bottom_blob->allocator;
    uVar7 = bottom_blob->dims;
    uVar8 = bottom_blob->w;
    uVar9 = bottom_blob->h;
    uVar10 = bottom_blob->d;
    local_168.c = bottom_blob->c;
    local_168.cstep = bottom_blob->cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_168.dims = uVar7;
    local_168.w = uVar8;
    local_168.h = uVar9;
    local_168.d = uVar10;
    if (iVar39 != 1) {
      m.data = *(void **)opt;
      uVar11 = opt->openmp_blocktime;
      uVar12 = opt->use_winograd_convolution;
      uVar14 = opt->use_sgemm_convolution;
      uVar16 = opt->use_int8_inference;
      uVar18 = opt->use_vulkan_compute;
      uVar17 = CONCAT11(uVar18,uVar16);
      uVar15 = CONCAT21(uVar17,uVar14);
      uVar13 = CONCAT31(uVar15,uVar12);
      m.allocator = *(Allocator **)&opt->use_bf16_storage;
      m._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
      uVar19 = opt->flush_denormals;
      uVar20 = opt->use_local_pool_allocator;
      uVar22 = opt->use_reserved_1;
      uVar24 = opt->use_reserved_2;
      uVar26 = opt->use_reserved_3;
      uVar25 = CONCAT11(uVar26,uVar24);
      uVar23 = CONCAT21(uVar25,uVar22);
      uVar21 = CONCAT31(uVar23,uVar20);
      uVar27._0_1_ = opt->use_reserved_4;
      uVar27._1_1_ = opt->use_reserved_5;
      uVar27._2_1_ = opt->use_reserved_6;
      uVar27._3_1_ = opt->use_reserved_7;
      uVar28 = opt->use_reserved_8;
      uVar29 = opt->use_reserved_9;
      uVar31 = opt->use_reserved_10;
      uVar33 = opt->use_reserved_11;
      uVar32 = CONCAT11(uVar33,uVar31);
      uVar30 = CONCAT21(uVar32,uVar29);
      uVar27._4_4_ = CONCAT31(uVar30,uVar28);
      m.c = (int)uVar27;
      m.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
      m.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      m.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m.elempack = uVar11;
      m._28_4_ = uVar13;
      m.h = uVar19;
      m.d = uVar21;
      m._60_4_ = uVar27._4_4_;
      convert_packing(bottom_blob,&local_168,1,(Option *)&m);
    }
    unaff_EBP = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86_avx2 +
                                      (long)this->_vptr_Crop_x86_avx2[-3]),&local_168,top_blob,opt);
    piVar2 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return unaff_EBP;
}

Assistant:

int Crop_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}